

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

string * __thiscall
nuraft::raft_server::get_user_ctx_abi_cxx11_(string *__return_storage_ptr__,raft_server *this)

{
  ptr<cluster_config> c_conf;
  _func_int **local_20;
  element_type *local_18;
  
  get_config((raft_server *)&stack0xffffffffffffffe0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_20[3],local_20[4] + (long)local_20[3]);
  if (local_18 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string raft_server::get_user_ctx() const {
    ptr<cluster_config> c_conf = get_config();
    return c_conf->get_user_ctx();
}